

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O0

void DwaCompressor_destroy(DwaCompressor *me)

{
  long in_RDI;
  int i_1;
  size_t i;
  int c;
  int local_1c;
  ulong local_18;
  int local_c;
  
  if (*(long *)(in_RDI + 0x50) != 0) {
    internal_exr_free((void *)0x10e313);
  }
  if (*(long *)(in_RDI + 0x60) != 0) {
    internal_exr_free((void *)0x10e32d);
  }
  if (*(long *)(in_RDI + 0x70) != 0) {
    internal_exr_free((void *)0x10e347);
  }
  if (*(long *)(in_RDI + 0x30) != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x28); local_c = local_c + 1) {
      DctCoderChannelData_destroy((DctCoderChannelData *)0x10e38a);
    }
    internal_exr_free((void *)0x10e3a5);
  }
  if (*(long *)(in_RDI + 0x38) != 0) {
    internal_exr_free((void *)0x10e3bf);
  }
  if ((*(Classifier **)(in_RDI + 0x40) != sLegacyChannelRules) &&
     (*(Classifier **)(in_RDI + 0x40) != sDefaultChannelRules)) {
    for (local_18 = 0; local_18 < *(ulong *)(in_RDI + 0x48); local_18 = local_18 + 1) {
      Classifier_destroy((Classifier *)0x10e413);
    }
    internal_exr_free((void *)0x10e431);
  }
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    if (*(long *)(in_RDI + 0x80 + (long)local_1c * 8) != 0) {
      internal_exr_free((void *)0x10e46c);
    }
  }
  return;
}

Assistant:

static void
DwaCompressor_destroy (DwaCompressor* me)
{
    if (me->_packedAcBuffer) internal_exr_free (me->_packedAcBuffer);
    if (me->_packedDcBuffer) internal_exr_free (me->_packedDcBuffer);
    if (me->_rleBuffer) internal_exr_free (me->_rleBuffer);

    if (me->_channelData)
    {
        for (int c = 0; c < me->_numChannels; ++c)
            DctCoderChannelData_destroy (&(me->_channelData[c]._dctData));

        internal_exr_free (me->_channelData);
    }

    if (me->_cscChannelSets) internal_exr_free (me->_cscChannelSets);
    if (me->_channelRules != sLegacyChannelRules &&
        me->_channelRules != sDefaultChannelRules)
    {
        for (size_t i = 0; i < me->_channelRuleCount; ++i)
            Classifier_destroy (&(me->_channelRules[i]));
        internal_exr_free (me->_channelRules);
    }

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        if (me->_planarUncBuffer[i])
            internal_exr_free (me->_planarUncBuffer[i]);
    }
}